

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav.c
# Opt level: O1

void fsnav_init_gnss_gps_const(fsnav_gps_const *gps_const)

{
  double dVar1;
  
  gps_const->mu = 398600500000000.0;
  gps_const->u = 7.2921151467e-05;
  gps_const->a = 6378137.0;
  gps_const->e2 = 0.006694379990141;
  gps_const->F = -4.442807633e-10;
  gps_const->F1 = 1575420000.0;
  dVar1 = (fsnav->gnss_const).c;
  gps_const->L1 = dVar1 / 1575420000.0;
  gps_const->F2 = 1227600000.0;
  gps_const->L2 = dVar1 / 1227600000.0;
  return;
}

Assistant:

void fsnav_init_gnss_gps_const(fsnav_gps_const* gps_const)
{
	gps_const->mu =  3.986005e14;                      // Earth gravity constant as in IS-GPS-200J (22 May 2018), m^3/s^2
	gps_const->u  =  7.2921151467e-5;                  // Earth rotation rate as in IS-GPS-200J (22 May 2018), rad/s
	gps_const->a  =  6378137.0;                        // Earth ellipsoid semi-major axis as in WGS-84(G1762) 2014-07-08, m
	gps_const->e2 =  6.694379990141e-3;                // Earth ellipsoid first eccentricity squared as in WGS-84(G1762) 2014-07-08
	gps_const->F  = -4.442807633e-10;                  // relativistic correction constant as in IS-GPS-200J (22 May 2018), s/sqrt(m)
	gps_const->F1 =  1575.42e6;                        // nominal frequency for L1 signal as in IS-GPS-200J (22 May 2018)
	gps_const->L1 =  fsnav->gnss_const.c/gps_const->F1; // nominal wavelength for L1 signal
	gps_const->F2 =  1227.60e6;                        // nominal frequency for L2 signal as in IS-GPS-200J (22 May 2018)
	gps_const->L2 =  fsnav->gnss_const.c/gps_const->F2; // nominal wavelength for L2 signal
}